

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printStruct(PrinterStream *this,Structure *s)

{
  CodePrinter *pCVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  long lVar7;
  Member *pMVar8;
  Member *m;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  char s_1 [2];
  Indent indent;
  char local_b2 [2];
  string local_b0;
  PrinterStream *local_90;
  string local_88;
  Member *local_68;
  string local_60;
  Indent local_40;
  
  pCVar1 = this->out;
  text._M_str = "struct ";
  text._M_len = 7;
  local_90 = this;
  choc::text::CodePrinter::writeBlock(pCVar1,text);
  text_00._M_str = (s->name)._M_dataplus._M_p;
  text_00._M_len = (s->name)._M_string_length;
  choc::text::CodePrinter::writeBlock(pCVar1,text_00);
  local_b0.field_2._M_allocated_capacity._0_2_ = 10;
  local_b0._M_string_length = 1;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  choc::text::CodePrinter::append(pCVar1,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                             local_b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  sVar2 = (s->members).numActive;
  if (sVar2 == 0) {
    iVar6 = 2;
  }
  else {
    pMVar8 = (s->members).items;
    lVar7 = sVar2 << 6;
    iVar6 = 0;
    do {
      getTypeDescription_abi_cxx11_(&local_b0,local_90,&pMVar8->type);
      iVar3 = (int)local_b0._M_string_length;
      if ((int)local_b0._M_string_length < iVar6) {
        iVar3 = iVar6;
      }
      iVar6 = iVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                 local_b0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      pMVar8 = pMVar8 + 1;
      lVar7 = lVar7 + -0x40;
    } while (lVar7 != 0);
    iVar6 = iVar6 + 2;
  }
  paVar5 = &local_b0.field_2;
  choc::text::CodePrinter::Indent::Indent(&local_40,local_90->out,2,'{','}');
  sVar2 = (s->members).numActive;
  if (sVar2 != 0) {
    pMVar8 = (s->members).items;
    local_68 = pMVar8 + sVar2;
    do {
      pCVar1 = local_90->out;
      getTypeDescription_abi_cxx11_(&local_60,local_90,&pMVar8->type);
      padded(&local_88,&local_60,iVar6);
      text_01._M_str = local_88._M_dataplus._M_p;
      text_01._M_len = local_88._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar1,text_01);
      text_02._M_str = (pMVar8->name)._M_dataplus._M_p;
      text_02._M_len = (pMVar8->name)._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar1,text_02);
      local_b2[0] = ';';
      local_b2[1] = '\0';
      local_b0._M_dataplus._M_p = (pointer)paVar5;
      sVar4 = strlen(local_b2);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,local_b2,local_b2 + sVar4)
      ;
      choc::text::CodePrinter::append(pCVar1,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar5) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                 local_b0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_b0.field_2._M_allocated_capacity._0_2_ = 10;
      local_b0._M_string_length = 1;
      local_b0._M_dataplus._M_p = (pointer)paVar5;
      choc::text::CodePrinter::append(pCVar1,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar5) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                 local_b0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != local_68);
  }
  choc::text::CodePrinter::Indent::~Indent(&local_40);
  choc::text::CodePrinter::operator<<(local_90->out,(BlankLine *)&blankLine);
  return;
}

Assistant:

void printStruct (const Structure& s) const
        {
            out << "struct " << s.getName() << newLine;

            int maxTypeLen = 0;

            for (auto& m : s.getMembers())
                maxTypeLen = std::max (maxTypeLen, (int) getTypeDescription (m.type).length());

            {
                auto indent = out.createIndentWithBraces (2);

                for (auto& m : s.getMembers())
                    out << padded (getTypeDescription (m.type), maxTypeLen + 2) << m.name << ';' << newLine;
            }

            out << blankLine;
        }